

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

string * __thiscall
gl3cts::PerVertexValidationTest::getShaderStageName_abi_cxx11_
          (string *__return_storage_ptr__,PerVertexValidationTest *this,_shader_stage shader_stage)

{
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"?!",&local_11);
  switch(shader_stage) {
  case SHADER_STAGE_FRAGMENT:
    break;
  case SHADER_STAGE_GEOMETRY:
    break;
  case SHADER_STAGE_GEOMETRY|SHADER_STAGE_FRAGMENT:
  case SHADER_STAGE_TESSELLATION_CONTROL|SHADER_STAGE_FRAGMENT:
  case SHADER_STAGE_TESSELLATION_CONTROL|SHADER_STAGE_GEOMETRY:
  case SHADER_STAGE_TESSELLATION_CONTROL|SHADER_STAGE_GEOMETRY|SHADER_STAGE_FRAGMENT:
    goto switchD_00ae785c_caseD_3;
  case SHADER_STAGE_TESSELLATION_CONTROL:
    break;
  case SHADER_STAGE_TESSELLATION_EVALUATION:
    break;
  default:
    if (shader_stage != SHADER_STAGE_VERTEX) {
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
switchD_00ae785c_caseD_3:
  return __return_storage_ptr__;
}

Assistant:

std::string PerVertexValidationTest::getShaderStageName(_shader_stage shader_stage) const
{
	std::string result = "?!";

	switch (shader_stage)
	{
	case SHADER_STAGE_FRAGMENT:
		result = "fragment shader";
		break;
	case SHADER_STAGE_GEOMETRY:
		result = "geometry shader";
		break;
	case SHADER_STAGE_TESSELLATION_CONTROL:
		result = "tessellation control shader";
		break;
	case SHADER_STAGE_TESSELLATION_EVALUATION:
		result = "tessellation evaluation shader";
		break;
	case SHADER_STAGE_VERTEX:
		result = "vertex shader";
		break;
	}

	return result;
}